

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  char *__nptr;
  string *name;
  ulong uVar2;
  string *s;
  string *var;
  int i;
  int nMatches;
  char *nMatchesStr;
  cmMakefile *this_local;
  
  __nptr = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    for (var._0_4_ = 0; (int)var <= iVar1; var._0_4_ = (int)var + 1) {
      name = matchVariables_abi_cxx11_ + (int)var;
      GetSafeDefinition(this,name);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        AddDefinition(this,name,"");
        MarkVariableAsUsed(this,name);
      }
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    MarkVariableAsUsed(this,&nMatchesVariable_abi_cxx11_);
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr);
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}